

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall OPL::DOSBox::DBOPL::Channel::SetChanData(Channel *this,Chip *chip,Bit32u data)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = this->chanData ^ data;
  this->chanData = data;
  this->op[0].chanData = data;
  this->op[1].chanData = data;
  Operator::UpdateFrequency(this->op);
  Operator::UpdateFrequency(this->op + 1);
  if ((uVar2 & 0xff0000) != 0) {
    bVar1 = this->op[0].reg40;
    this->op[0].totalLevel =
         (uint)(*(byte *)((long)&this->op[0].chanData + 2) >>
               (*(byte *)((long)&KslShiftTable + (ulong)(bVar1 >> 6)) & 0x1f)) + (bVar1 & 0x3f) * 4;
    bVar1 = this->op[1].reg40;
    this->op[1].totalLevel =
         (uint)(*(byte *)((long)&this->op[1].chanData + 2) >>
               (*(byte *)((long)&KslShiftTable + (ulong)(bVar1 >> 6)) & 0x1f)) + (bVar1 & 0x3f) * 4;
  }
  if (uVar2 < 0x1000000) {
    return;
  }
  Operator::UpdateRates(this->op,chip);
  Operator::UpdateRates(this->op + 1,chip);
  return;
}

Assistant:

void Channel::SetChanData( const Chip* chip, Bit32u data ) {
	Bit32u change = chanData ^ data;
	chanData = data;
	Op( 0 )->chanData = data;
	Op( 1 )->chanData = data;
	//Since a frequency update triggered this, always update frequency
	Op( 0 )->UpdateFrequency();
	Op( 1 )->UpdateFrequency();
	if ( change & ( 0xff << SHIFT_KSLBASE ) ) {
		Op( 0 )->UpdateAttenuation();
		Op( 1 )->UpdateAttenuation();
	}
	if ( change & ( 0xff << SHIFT_KEYCODE ) ) {
		Op( 0 )->UpdateRates( chip );
		Op( 1 )->UpdateRates( chip );
	}
}